

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leave.hpp
# Opt level: O2

bool __thiscall
soplex::SPxSolverBase<double>::leave(SPxSolverBase<double> *this,int leaveIdx,bool polish)

{
  SPxBasisBase<double> *this_00;
  bool bVar1;
  UpdateVector<double> *pUVar2;
  SSVectorBase<double> *y;
  SSVectorBase<double> *y_00;
  SPxStatus stat;
  DataArray<soplex::SPxBasisBase<double>::Desc::Status> *pDVar3;
  int iVar4;
  int extraout_var;
  undefined4 extraout_var_00;
  long lVar5;
  SPxOut *pSVar6;
  double *pdVar7;
  pointer pdVar8;
  SSVectorBase<double> *x;
  VectorBase<double> *pVVar9;
  ulong uVar10;
  Real RVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  Status leaveStat;
  double enterBound;
  int leaveNum;
  double enterVal;
  double newUBbound;
  double leaveMax;
  SPxId enterId;
  SPxId leaveId;
  SPxId none;
  double leavebound;
  double local_88;
  double dStack_80;
  double newCoPrhs;
  double newLBbound;
  double local_68;
  undefined8 uStack_60;
  SVectorBase<double> *rhs;
  
  bVar1 = this->instableLeave;
  pUVar2 = this->theCoPvec;
  if (((pUVar2->thedelta).setupStatus == true) && ((pUVar2->thedelta).super_IdxSet.num == 0)) {
    SPxBasisBase<double>::coSolve
              (&this->super_SPxBasisBase<double>,&pUVar2->thedelta,
               &(this->unitVecs).data.
                super__Vector_base<soplex::UnitVectorBase<double>,_std::allocator<soplex::UnitVectorBase<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start[leaveIdx].super_SVectorBase<double>);
  }
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x86])(this);
  leaveId.super_DataKey.info = 0;
  leaveId.super_DataKey.idx = -1;
  none.super_DataKey.info = 0;
  none.super_DataKey.idx = -1;
  local_88 = 0.0;
  dStack_80 = 0.0;
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x7f])
            (this,leaveIdx,&leaveStat,&leaveId,&leaveMax,&leavebound,&leaveNum,&local_88);
  if ((!polish) && (this->m_maxCycle < this->m_numCycle)) {
    (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[(ulong)(0.0 < leaveMax) + 0x8b])
              (this);
    this->m_nonbasicValue = 0.0;
    this->m_nonbasicValueUpToDate = false;
  }
  enterVal = leaveMax;
  this->boundflips = 0;
  dVar14 = this->theShift;
  enterId.super_DataKey.info =
       (*this->theratiotester->_vptr_SPxRatioTester[8])
                 (this->theratiotester,&enterVal,leaveIdx,(ulong)polish);
  enterId.super_DataKey.idx = extraout_var;
  local_68 = this->theShift;
  uStack_60 = 0;
  RVar11 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
  if (RVar11 < ABS(local_68 - dVar14)) {
    this->m_nonbasicValue = 0.0;
    this->m_nonbasicValueUpToDate = false;
  }
  this->instableLeaveNum = -1;
  this->instableLeave = false;
  if (enterId.super_DataKey.info == 0) {
    (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x85])
              (this,(ulong)(uint)leaveNum,leaveId.super_DataKey,(ulong)(uint)leaveStat,0);
    (**(this->super_SPxBasisBase<double>)._vptr_SPxBasisBase)
              (&this->super_SPxBasisBase<double>,0xffffffffffffffff,&none,0,0);
    local_88 = 0.0;
    dStack_80 = 0.0;
    if (polish) {
      return false;
    }
    dVar14 = enterVal - leaveMax;
    RVar11 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
    if (ABS(dVar14) <= RVar11 || (bVar1 & 1U) != 0) {
      if (1 < (this->super_SPxBasisBase<double>).updateCount) {
        pSVar6 = this->spxout;
        if ((pSVar6 != (SPxOut *)0x0) && (4 < (int)pSVar6->m_verbosity)) {
          enterBound = (double)CONCAT44(enterBound._4_4_,pSVar6->m_verbosity);
          newUBbound._0_4_ = 5;
          (*pSVar6->_vptr_SPxOut[2])();
          pSVar6 = soplex::operator<<(this->spxout,"ILEAVE01 factorization triggered in ");
          pSVar6 = soplex::operator<<(pSVar6,"leave() for feasibility test");
          std::endl<char,std::char_traits<char>>(pSVar6->m_streams[pSVar6->m_verbosity]);
          (*this->spxout->_vptr_SPxOut[2])(this->spxout,&enterBound);
        }
        (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x75])(this);
        return true;
      }
      if ((this->recomputedVectors == false) &&
         (dVar14 = ABS(enterVal), dVar13 = leavetol(this), dVar14 < dVar13)) {
        pSVar6 = this->spxout;
        if ((pSVar6 != (SPxOut *)0x0) && (4 < (int)pSVar6->m_verbosity)) {
          enterBound = (double)CONCAT44(enterBound._4_4_,pSVar6->m_verbosity);
          newUBbound._0_4_ = 5;
          (*pSVar6->_vptr_SPxOut[2])();
          pSVar6 = soplex::operator<<(this->spxout,
                                      "ILEAVE11 clean up step to reduce numerical errors");
          std::endl<char,std::char_traits<char>>(pSVar6->m_streams[pSVar6->m_verbosity]);
          (*this->spxout->_vptr_SPxOut[2])(this->spxout,&enterBound);
        }
        computeFrhs(this);
        SPxBasisBase<double>::solve
                  (&this->super_SPxBasisBase<double>,&this->theFvec->super_VectorBase<double>,
                   this->theFrhs);
        computeFtest(this);
        this->recomputedVectors = true;
        return true;
      }
      pSVar6 = this->spxout;
      if ((pSVar6 != (SPxOut *)0x0) && (4 < (int)pSVar6->m_verbosity)) {
        enterBound = (double)CONCAT44(enterBound._4_4_,pSVar6->m_verbosity);
        newUBbound._0_4_ = 5;
        (*pSVar6->_vptr_SPxOut[2])();
        pSVar6 = soplex::operator<<(this->spxout,"ILEAVE02 unboundedness/infeasibility found ");
        pSVar6 = soplex::operator<<(pSVar6,"in leave()");
        std::endl<char,std::char_traits<char>>(pSVar6->m_streams[pSVar6->m_verbosity]);
        (*this->spxout->_vptr_SPxOut[2])(this->spxout,&enterBound);
      }
      if (this->theRep == COLUMN) {
LAB_0019c1e1:
        computeDualfarkas4Col(this,enterVal);
        stat = INFEASIBLE;
        goto LAB_0019c447;
      }
LAB_0019c43d:
      computePrimalray4Row(this,enterVal);
      stat = UNBOUNDED;
LAB_0019c447:
      setBasisStatus(this,stat);
      return false;
    }
    pdVar8 = (this->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    this->instableLeaveNum = leaveIdx;
    dVar14 = pdVar8[leaveIdx];
    this->instableLeaveVal = dVar14;
    dVar14 = dVar14 / 10.0;
LAB_0019c283:
    pdVar8[leaveIdx] = dVar14;
  }
  else {
    this_00 = &this->super_SPxBasisBase<double>;
    if (&enterId == (this->super_SPxBasisBase<double>).theBaseId.data + leaveIdx) {
      (**(this->super_SPxBasisBase<double>)._vptr_SPxBasisBase)(this_00,leaveIdx,&none,0,0);
      pDVar3 = &(this->super_SPxBasisBase<double>).thedesc.colstat;
      if (leaveId.super_DataKey.info < 0) {
        pDVar3 = &(this->super_SPxBasisBase<double>).thedesc.rowstat;
      }
      lVar5 = (long)leaveNum;
      if (leaveStat == P_ON_UPPER) {
        pDVar3->data[lVar5] = P_ON_LOWER;
        pVVar9 = &this->theLCbound;
        if (leaveId.super_DataKey.info < 0) {
          pVVar9 = &this->theLRbound;
        }
        (this->theCoPrhs->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[leaveIdx] =
             (pVVar9->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar5];
        (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[leaveIdx] = 0.0;
        pdVar7 = (double *)infinity();
        dVar14 = -*pdVar7;
      }
      else {
        pDVar3->data[lVar5] = P_ON_UPPER;
        pVVar9 = &this->theUCbound;
        if (leaveId.super_DataKey.info < 0) {
          pVVar9 = &this->theURbound;
        }
        (this->theCoPrhs->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[leaveIdx] =
             (pVVar9->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar5];
        pdVar7 = (double *)infinity();
        (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[leaveIdx] = *pdVar7;
        dVar14 = 0.0;
      }
      dVar13 = enterVal;
      (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[leaveIdx] = dVar14;
      this->theCoPvec->theval = enterVal;
      this->thePvec->theval = enterVal;
      dVar12 = epsilon(this);
      dVar14 = enterVal;
      if ((dVar12 < dVar13) || (dVar13 = epsilon(this), dVar14 < -dVar13)) {
        (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x87])(this);
      }
      this->theFvec->theval = 0.0;
      pdVar8 = (this->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      this->m_pricingViol = pdVar8[leaveIdx] + this->m_pricingViol;
      pdVar8[leaveIdx] = -pdVar8[leaveIdx];
    }
    else {
      iVar4 = (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
                super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x7e])(this,&enterId);
      rhs = (SVectorBase<double> *)CONCAT44(extraout_var_00,iVar4);
      y = this->solveVector2;
      y_00 = this->solveVector3;
      x = &this->theFvec->thedelta;
      if (y == (SSVectorBase<double> *)0x0) {
        if (y_00 != (SSVectorBase<double> *)0x0) {
          SPxBasisBase<double>::solve4update(this_00,x,y_00,rhs,this->solveVector3rhs);
          goto LAB_0019bc71;
        }
        SPxBasisBase<double>::solve4update(this_00,x,rhs);
      }
      else if (y_00 == (SSVectorBase<double> *)0x0) {
        SPxBasisBase<double>::solve4update(this_00,x,y,rhs,this->solveVector2rhs);
      }
      else {
        SPxBasisBase<double>::solve4update
                  (this_00,x,y,y_00,rhs,this->solveVector2rhs,this->solveVector3rhs);
LAB_0019bc71:
        VectorBase<double>::operator-=(&(this->primVec).super_VectorBase<double>,this->solveVector3)
        ;
        this->totalboundflips = this->totalboundflips + this->boundflips;
      }
      dVar13 = leavebound;
      dVar14 = ((this->super_SPxLPBase<double>)._tolerances.
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               s_epsilon_multiplier;
      uVar10 = -(ulong)(dVar14 == 1.0);
      if (ABS((this->theFvec->thedelta).super_VectorBase<double>.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[leaveIdx]) <
          (double)(~uVar10 & (ulong)(dVar14 * 1e-10) | uVar10 & 0x3ddb7cdfd9d7bdbb)) {
        if (bVar1 != false) {
          pSVar6 = this->spxout;
          if ((pSVar6 != (SPxOut *)0x0) && (4 < (int)pSVar6->m_verbosity)) {
            enterBound = (double)CONCAT44(enterBound._4_4_,pSVar6->m_verbosity);
            newUBbound._0_4_ = 5;
            (*pSVar6->_vptr_SPxOut[2])();
            pSVar6 = soplex::operator<<(this->spxout,"ILEAVE03 unboundedness/infeasibility found ");
            pSVar6 = soplex::operator<<(pSVar6,"in leave()");
            std::endl<char,std::char_traits<char>>(pSVar6->m_streams[pSVar6->m_verbosity]);
            (*this->spxout->_vptr_SPxOut[2])(this->spxout,&enterBound);
          }
          (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
            super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x85])
                    (this,(ulong)(uint)leaveNum,leaveId.super_DataKey,(ulong)(uint)leaveStat,0);
          (**(this->super_SPxBasisBase<double>)._vptr_SPxBasisBase)
                    (this_00,0xffffffffffffffff,&none,0,0);
          local_88 = 0.0;
          dStack_80 = 0.0;
          if (this->theRep != ROW) goto LAB_0019c1e1;
          goto LAB_0019c43d;
        }
        SSVectorBase<double>::clear(&this->theFvec->thedelta);
        (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x85])
                  (this,(ulong)(uint)leaveNum,leaveId.super_DataKey,(ulong)(uint)leaveStat,rhs);
        (**(this->super_SPxBasisBase<double>)._vptr_SPxBasisBase)
                  (this_00,0xffffffffffffffff,&none,0,0);
        pdVar8 = (this->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        dVar14 = pdVar8[leaveIdx] * 0.01;
        goto LAB_0019c283;
      }
      dVar12 = epsilon(this);
      dVar14 = leavebound;
      if ((dVar12 < dVar13) || (dVar13 = epsilon(this), dVar14 < -dVar13)) {
        enterBound = -leavebound;
        VectorBase<double>::multAdd<double,double>
                  (this->theFrhs,&enterBound,
                   (this->super_SPxBasisBase<double>).matrix.data[leaveIdx]);
      }
      (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x80])
                (leaveMax,this,enterId.super_DataKey,&enterBound,&newUBbound,&newLBbound,&newCoPrhs,
                 &local_88);
      dVar14 = enterBound;
      (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[leaveIdx] =
           (double)CONCAT44(newUBbound._4_4_,newUBbound._0_4_);
      (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[leaveIdx] = newLBbound;
      (this->theCoPrhs->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[leaveIdx] = newCoPrhs;
      dVar12 = epsilon(this);
      dVar13 = enterBound;
      if ((dVar12 < dVar14) || (dVar14 = epsilon(this), dVar13 < -dVar14)) {
        VectorBase<double>::multAdd<double,double>(this->theFrhs,&enterBound,rhs);
      }
      dVar14 = enterVal;
      this->theCoPvec->theval = enterVal;
      this->thePvec->theval = enterVal;
      dVar12 = epsilon(this);
      dVar13 = enterVal;
      if ((dVar12 < dVar14) || (dVar14 = epsilon(this), dVar13 < -dVar14)) {
        (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x87])(this);
      }
      pUVar2 = this->theFvec;
      pUVar2->theval =
           -((pUVar2->super_VectorBase<double>).val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[leaveIdx] - leavebound) /
           (pUVar2->thedelta).super_VectorBase<double>.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start[leaveIdx];
      UpdateVector<double>::update(pUVar2);
      (this->theFvec->super_VectorBase<double>).val.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [leaveIdx] = enterBound - this->theFvec->theval;
      updateFtest(this);
      updateNonbasicValue(this,local_88 + dStack_80);
      (**(this->super_SPxBasisBase<double>)._vptr_SPxBasisBase)
                (this_00,leaveIdx,&enterId,rhs,&this->theFvec->thedelta);
    }
    dVar13 = leaveMax;
    dVar12 = entertol(this);
    dVar14 = enterVal;
    if (((dVar12 < dVar13) && (dVar13 = entertol(this), dVar14 <= dVar13)) ||
       ((dVar13 = entertol(this), dVar14 = enterVal, leaveMax < -dVar13 &&
        (dVar13 = entertol(this), -dVar13 <= dVar14)))) {
      dVar14 = (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[leaveIdx];
      pdVar7 = (double *)infinity();
      if (*pdVar7 <= dVar14) {
        dVar14 = (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[leaveIdx];
        pdVar7 = (double *)infinity();
        if (dVar14 <= -*pdVar7 || leaveStat == P_FREE) {
          return true;
        }
      }
      else if (leaveStat == P_FREE) {
        return true;
      }
      if (leaveStat != D_FREE) {
        this->m_numCycle = this->m_numCycle + 1;
        this->leaveCycles = this->leaveCycles + 1;
        return true;
      }
      return true;
    }
    this->m_numCycle = this->m_numCycle / 2;
  }
  return true;
}

Assistant:

bool SPxSolverBase<R>::leave(int leaveIdx, bool polish)
{
   assert(leaveIdx < dim() && leaveIdx >= 0);
   assert(type() == LEAVE);
   assert(initialized);

   bool instable = instableLeave;
   assert(!instable || instableLeaveNum >= 0);

   /*
     Before performing the actual basis update, we must determine, how this
     is to be accomplished.
     When using steepest edge pricing this solve is already performed by the pricer
   */
   if(theCoPvec->delta().isSetup() && theCoPvec->delta().size() == 0)
   {
      this->coSolve(theCoPvec->delta(), unitVecs[leaveIdx]);
   }

#ifdef ENABLE_ADDITIONAL_CHECKS
   else
   {
      SSVectorBase<R>  tmp(dim(), this->tolerances());
      tmp.clear();
      this->coSolve(tmp, unitVecs[leaveIdx]);
      tmp -= theCoPvec->delta();

      if(tmp.length() > leavetol())
      {
         // This happens very frequently and does usually not hurt, so print
         // these warnings only with verbose level INFO2 and higher.
         SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "WLEAVE60 iteration=" << basis().iteration()
                       << ": coPvec.delta error = " << tmp.length()
                       << std::endl;)
      }
   }

#endif  // ENABLE_ADDITIONAL_CHECKS

   setupPupdate();

   assert(thePvec->isConsistent());
   assert(theCoPvec->isConsistent());

   typename SPxBasisBase<R>::Desc::Status leaveStat;      // status of leaving var
   SPxId leaveId;        // id of leaving var
   SPxId none;           // invalid id used if leave fails
   R leaveMax;       // maximium lambda of leaving var
   R leavebound;     // current fVec value of leaving var
   int  leaveNum;       // number of leaveId in bounds
   StableSum<R> objChange; // amount of change in the objective function

   getLeaveVals(leaveIdx, leaveStat, leaveId, leaveMax, leavebound, leaveNum, objChange);

   if(!polish && m_numCycle > m_maxCycle)
   {
      if(leaveMax > 0)
         perturbMaxLeave();
      else
         perturbMinLeave();

      //@ m_numCycle /= 2;
      // perturbation invalidates the currently stored nonbasic value
      forceRecompNonbasicValue();
   }

   //@ testBounds();

   R enterVal = leaveMax;
   boundflips = 0;
   R oldShift = theShift;
   SPxId enterId = theratiotester->selectEnter(enterVal, leaveIdx, polish);

   if(NE(theShift, oldShift, this->tolerances()->epsilon()))
   {
      SPxOut::debug(this,
                    "DLEAVE71 trigger recomputation of nonbasic value due to shifts in ratiotest\n");
      forceRecompNonbasicValue();
   }

   assert(!enterId.isValid() || !isBasic(enterId));

   instableLeaveNum = -1;
   instableLeave = false;

   /*
     No variable could be selected to enter the basis and even the leaving
     variable is unbounded.
   */
   if(!enterId.isValid())
   {
      /* the following line originally was below in "rejecting leave" case;
         we need it in the unbounded/infeasible case, too, to have the
         correct basis size */
      rejectLeave(leaveNum, leaveId, leaveStat);
      this->change(-1, none, nullptr);
      objChange = R(0.0); // the nonbasicValue is not supposed to be updated in this case

      if(polish)
         return false;

      if(NE(enterVal, leaveMax, this->tolerances()->epsilon()))
      {
         SPxOut::debug(this, "DLEAVE61 rejecting leave A (leaveIdx={}, theCoTest={})\n", leaveIdx,
                       theCoTest[leaveIdx]);

         /* In the LEAVE algorithm, when for a selected leaving variable we find only
            an instable entering variable, then the basis change is not conducted.
            Instead, we save the leaving variable's index in instableLeaveNum and scale
            theCoTest[leaveIdx] down by some factor, hoping to find a different leaving
            variable with a stable entering variable.
            If this fails, however, and no more leaving variable is found, we have to
            perform the instable basis change using instableLeaveNum. In this (and only
            in this) case, the flag instableLeave is set to true.

            enterVal != leaveMax is the case that selectEnter has found only an instable entering
            variable. We store this leaving variable for later -- if we are not already in the
            instable case: then we continue and conclude unboundedness/infeasibility */
         if(!instable)
         {
            instableLeaveNum = leaveIdx;

            // Note: These changes do not survive a refactorization
            instableLeaveVal = theCoTest[leaveIdx];
            theCoTest[leaveIdx] = instableLeaveVal / 10.0;

            return true;
         }
      }

      if(this->lastUpdate() > 1)
      {
         SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "ILEAVE01 factorization triggered in "
                       << "leave() for feasibility test" << std::endl;)

         try
         {
            factorize();
         }
         catch(const SPxStatusException& E)
         {
            // don't exit immediately but handle the singularity correctly
            assert(SPxBasisBase<R>::status() == SPxBasisBase<R>::SINGULAR);
            SPX_MSG_INFO3((*this->spxout),
                          (*this->spxout) << "Caught exception in factorization: " << E.what() <<
                          std::endl;)
         }

         /* after a factorization, the leaving column/row might not be infeasible or suboptimal anymore, hence we do
          * not try to call leave(leaveIdx), but rather return to the main solving loop and call the pricer again
          */
         return true;
      }

      /* do not exit with status infeasible or unbounded if there is only a very small violation */
      if(!recomputedVectors && spxAbs(enterVal) < leavetol())
      {
         SPX_MSG_INFO3((*this->spxout),
                       (*this->spxout) << "ILEAVE11 clean up step to reduce numerical errors" <<
                       std::endl;)

         computeFrhs();
         SPxBasisBase<R>::solve(*theFvec, *theFrhs);
         computeFtest();

         /* only do this once per solve */
         recomputedVectors = true;

         return true;
      }

      SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "ILEAVE02 unboundedness/infeasibility found "
                    << "in leave()" << std::endl;)

      if(rep() != COLUMN)
      {
         computePrimalray4Row(enterVal);
         setBasisStatus(SPxBasisBase<R>::UNBOUNDED);
      }
      else
      {
         computeDualfarkas4Col(enterVal);
         setBasisStatus(SPxBasisBase<R>::INFEASIBLE);
      }

      return false;
   }
   else
   {
      /*
        If an entering variable has been found, a regular basis update is to
        be performed.
      */
      if(enterId != this->baseId((leaveIdx)))
      {
         const SVectorBase<R>& newVector = *enterVector(enterId);

         // update feasibility vectors
         if(solveVector2 != nullptr && solveVector3 != nullptr)
         {
            assert(solveVector2->isConsistent());
            assert(solveVector2rhs->isSetup());
            assert(solveVector3->isConsistent());
            assert(solveVector3rhs->isSetup());
            assert(boundflips > 0);
            SPxBasisBase<R>::solve4update(theFvec->delta(),
                                          *solveVector2,
                                          *solveVector3,
                                          newVector,
                                          *solveVector2rhs,
                                          *solveVector3rhs);

            // perform update of basic solution
            primVec -= (*solveVector3);
            SPxOut::debug(this, "ILBFRT02 breakpoints passed / bounds flipped = {}\n", boundflips);
            totalboundflips += boundflips;
         }
         else if(solveVector2 != nullptr)
         {
            assert(solveVector2->isConsistent());
            assert(solveVector2rhs->isSetup());

            SPxBasisBase<R>::solve4update(theFvec->delta(),
                                          *solveVector2,
                                          newVector,
                                          *solveVector2rhs);
         }
         else if(solveVector3 != nullptr)
         {
            assert(solveVector3->isConsistent());
            assert(solveVector3rhs->isSetup());
            assert(boundflips > 0);
            SPxBasisBase<R>::solve4update(theFvec->delta(),
                                          *solveVector3,
                                          newVector,
                                          *solveVector3rhs);

            // perform update of basic solution
            primVec -= (*solveVector3);
            SPxOut::debug(this, "ILBFRT02 breakpoints passed / bounds flipped = {}\n", boundflips);
            totalboundflips += boundflips;
         }
         else
            SPxBasisBase<R>::solve4update(theFvec->delta(), newVector);

#ifdef ENABLE_ADDITIONAL_CHECKS
         {
            SSVectorBase<R>  tmp(dim(), this->tolerances());
            SPxBasisBase<R>::solve(tmp, newVector);
            tmp -= fVec().delta();

            if(tmp.length() > entertol())
            {
               // This happens very frequently and does usually not hurt, so print
               // these warnings only with verbose level INFO2 and higher.
               SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "WLEAVE62\t(" << tmp.length() << ")\n";)
            }
         }
#endif  // ENABLE_ADDITIONAL_CHECKS

         R reject_treshold = this->tolerances()->scaleAccordingToEpsilon(default_reject_leave_tol);

         if(spxAbs(theFvec->delta()[leaveIdx]) < reject_treshold)
         {
            if(instable)
            {
               /* We are in the case that for all leaving variables only instable entering
                  variables were found: Thus, above we already accepted such an instable
                  entering variable. Now even this seems to be impossible, thus we conclude
                  unboundedness/infeasibility. */
               SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "ILEAVE03 unboundedness/infeasibility found "
                             << "in leave()" << std::endl;)

               rejectLeave(leaveNum, leaveId, leaveStat);
               this->change(-1, none, nullptr);
               objChange = R(0.0); // the nonbasicValue is not supposed to be updated in this case

               /**@todo if shift() is not zero we must not conclude unboundedness */
               if(rep() == ROW)
               {
                  computePrimalray4Row(enterVal);
                  setBasisStatus(SPxBasisBase<R>::UNBOUNDED);
               }
               else
               {
                  computeDualfarkas4Col(enterVal);
                  setBasisStatus(SPxBasisBase<R>::INFEASIBLE);
               }

               return false;
            }
            else
            {
               theFvec->delta().clear();
               rejectLeave(leaveNum, leaveId, leaveStat, &newVector);
               this->change(-1, none, nullptr);
               objChange = R(0.0); // the nonbasicValue is not supposed to be updated in this case

               SPxOut::debug(this, "DLEAVE63 rejecting leave B (leaveIdx={}, theCoTest={})\n", leaveIdx,
                             theCoTest[leaveIdx]);

               // Note: These changes do not survive a refactorization
               theCoTest[leaveIdx] *= 0.01;

               return true;
            }
         }

         //      process leaving variable
         if(leavebound > epsilon() || leavebound < -epsilon())
            theFrhs->multAdd(-leavebound, this->baseVec(leaveIdx));

         //      process entering variable
         R enterBound;
         R newUBbound;
         R newLBbound;
         R newCoPrhs;

         try
         {
            getLeaveVals2(leaveMax, enterId, enterBound, newUBbound, newLBbound, newCoPrhs, objChange);
         }
         catch(const SPxException& F)
         {
            rejectLeave(leaveNum, leaveId, leaveStat);
            this->change(-1, none, nullptr);
            objChange = R(0.0); // the nonbasicValue is not supposed to be updated in this case
            throw F;
         }

         theUBbound[leaveIdx] = newUBbound;
         theLBbound[leaveIdx] = newLBbound;
         (*theCoPrhs)[leaveIdx] = newCoPrhs;

         if(enterBound > epsilon() || enterBound < -epsilon())
            theFrhs->multAdd(enterBound, newVector);

         // update pricing vectors
         theCoPvec->value() = enterVal;
         thePvec->value() = enterVal;

         if(enterVal > epsilon() || enterVal < -epsilon())
            doPupdate();

         // update feasibility vector
         theFvec->value() = -((*theFvec)[leaveIdx] - leavebound)
                            / theFvec->delta()[leaveIdx];
         theFvec->update();
         (*theFvec)[leaveIdx] = enterBound - theFvec->value();
         updateFtest();

         // update objective funtion value
         updateNonbasicValue(objChange);

         //  change basis matrix
         this->change(leaveIdx, enterId, &newVector, &(theFvec->delta()));
      }

      /*
        No entering vector has been selected from the basis. However, if the
        shift amount for |coPvec| is bounded, we are in the case, that the
        entering variable is moved from one bound to its other, before any of
        the basis feasibility variables reaches their bound. This may only
        happen in primal/columnwise case with upper and lower bounds on
        variables.
      */
      else
      {
         // @todo update obj function value here!!!
         assert(rep() == ROW);
         typename SPxBasisBase<R>::Desc& ds = this->desc();

         this->change(leaveIdx, none, nullptr);

         if(leaveStat == SPxBasisBase<R>::Desc::P_ON_UPPER)
         {
            if(leaveId.isSPxRowId())
            {
               ds.rowStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_LOWER;
               (*theCoPrhs)[leaveIdx] = theLRbound[leaveNum];
            }
            else
            {
               ds.colStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_LOWER;
               (*theCoPrhs)[leaveIdx] = theLCbound[leaveNum];
            }

            theUBbound[leaveIdx] = 0;
            theLBbound[leaveIdx] = R(-infinity);
         }
         else
         {
            assert(leaveStat == SPxBasisBase<R>::Desc::P_ON_LOWER);

            if(leaveId.isSPxRowId())
            {
               ds.rowStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_UPPER;
               (*theCoPrhs)[leaveIdx] = theURbound[leaveNum];
            }
            else
            {
               ds.colStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_UPPER;
               (*theCoPrhs)[leaveIdx] = theUCbound[leaveNum];
            }

            theUBbound[leaveIdx] = R(infinity);
            theLBbound[leaveIdx] = 0;
         }

         // update copricing vector
         theCoPvec->value() = enterVal;
         thePvec->value() = enterVal;

         if(enterVal > epsilon() || enterVal < -epsilon())
            doPupdate();

         // update feasibility vectors
         theFvec->value() = 0;
         assert(theCoTest[leaveIdx] < 0.0);
         m_pricingViol += theCoTest[leaveIdx];
         theCoTest[leaveIdx] *= -1;
      }

      if((leaveMax > entertol() && enterVal <= entertol()) || (leaveMax < -entertol()
            && enterVal >= -entertol()))
      {
         if((theUBbound[leaveIdx] < R(infinity) || theLBbound[leaveIdx] > R(-infinity))
               && leaveStat != SPxBasisBase<R>::Desc::P_FREE
               && leaveStat != SPxBasisBase<R>::Desc::D_FREE)
         {
            m_numCycle++;
            leaveCycles++;
         }
      }
      else
         m_numCycle /= 2;

#ifdef ENABLE_ADDITIONAL_CHECKS
      {
         VectorBase<R> tmp = fVec();
         this->multBaseWith(tmp);
         tmp -= fRhs();

         if(tmp.length() > entertol())
         {
            // This happens very frequently and does usually not hurt, so print
            // these warnings only with verbose level INFO2 and higher.
            SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "WLEAVE64\t" << basis().iteration()
                          << ": fVec error = " << tmp.length() << std::endl;)
            SPxBasisBase<R>::solve(tmp, fRhs());
            tmp -= fVec();
            SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "WLEAVE65\t(" << tmp.length() << ")\n";)
         }
      }
#endif  // ENABLE_ADDITIONAL_CHECKS

      return true;
   }
}